

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ON_SHA1_Hash *
Internal_VertexHash(ON_SHA1_Hash *__return_storage_ptr__,ON_SubDHashType hash_type,
                   ON_SubDVertex *first_vertex,uint level_index,ON_SubDVertexIdIterator *vidit)

{
  uint uVar1;
  ON_SubDVertex *v;
  undefined7 in_register_00000031;
  ON_SHA1 sha1;
  ON_SHA1 local_b0;
  
  ON_SHA1::ON_SHA1(&local_b0);
  if ((int)CONCAT71(in_register_00000031,hash_type) != 0) {
    uVar1 = 0;
    for (; first_vertex != (ON_SubDVertex *)0x0; first_vertex = first_vertex->m_next_vertex) {
      if ((first_vertex->super_ON_SubDComponentBase).m_id < uVar1) {
        ON_SHA1::Reset(&local_b0);
        v = ON_SubDVertexIdIterator::FirstVertex(vidit);
        while (v != (ON_SubDVertex *)0x0) {
          if ((((v->super_ON_SubDComponentBase).m_level == level_index) &&
              ((v->super_ON_SubDComponentBase).m_id != 0)) &&
             ((v->super_ON_SubDComponentBase).m_archive_id != 0xffffffff)) {
            Internal_AccumulateVertexHash(&local_b0,hash_type,v);
          }
          v = ON_SubDVertexIdIterator::NextVertex(vidit);
        }
        break;
      }
      Internal_AccumulateVertexHash(&local_b0,hash_type,first_vertex);
      uVar1 = (first_vertex->super_ON_SubDComponentBase).m_id;
    }
  }
  ON_SHA1::Hash(__return_storage_ptr__,&local_b0);
  return __return_storage_ptr__;
}

Assistant:

static const ON_SHA1_Hash Internal_VertexHash(ON_SubDHashType hash_type, const ON_SubDVertex* first_vertex, unsigned int level_index, ON_SubDVertexIdIterator& vidit)
{
  ON_SHA1 sha1;
  if (ON_SubDHashType::Unset != hash_type)
  {
    unsigned prev_id = 0;
    for (const ON_SubDVertex* v = first_vertex; nullptr != v; v = v->m_next_vertex)
    {
      if (prev_id > v->m_id)
      {
        // must use slower vidit to get consistent results when complex editing juggles vertex order
        sha1.Reset();
        for (v = vidit.FirstVertex(); nullptr != v; v = vidit.NextVertex())
        {
          if ( level_index == v->SubdivisionLevel() && v->IsActive() )
            Internal_AccumulateVertexHash(sha1, hash_type, v);
        }
        break;
      }
      Internal_AccumulateVertexHash(sha1, hash_type, v);
      prev_id = v->m_id;
    }
  }
  return sha1.Hash();
}